

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  int iVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  long lVar10;
  _func_void_uv__work_ptr *__resolved;
  char *pcVar11;
  size_t sVar12;
  ssize_t sVar13;
  ulong uVar14;
  uv_loop_s *puVar15;
  _func_void_uv__work_ptr_int *p_Var16;
  size_t sVar17;
  code *process;
  _func_void_uv__work_ptr_int *p_Var18;
  pollfd pfd;
  stat pbuf;
  _func_void_uv__work_ptr_int *local_20a8;
  timeval local_2078;
  long local_2068;
  ulong local_2060;
  _func_void_uv__work_ptr_int *local_2058 [4];
  stat64 local_2038 [56];
  
  iVar1 = *(int *)&w[-7].done;
  puVar9 = (uint *)__errno_location();
LAB_00546de7:
  *puVar9 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    if (uv__fs_open_no_cloexec_support != '\0') {
LAB_00546e44:
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar5 = open64((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1))
      ;
      if (-1 < iVar5) {
        iVar6 = uv__cloexec_ioctl(iVar5,1);
        if (iVar6 != 0) {
          iVar6 = uv__close(iVar5);
          iVar5 = -1;
          if (iVar6 != 0) {
switchD_00546e07_default:
            abort();
          }
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_0054769b:
      p_Var18 = (_func_void_uv__work_ptr_int *)(long)iVar5;
      goto LAB_0054748e;
    }
    uVar7 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
    if ((int)uVar7 < 0) {
      if (*puVar9 != 0x16) break;
      uv__fs_open_no_cloexec_support = '\x01';
      goto LAB_00546e44;
    }
    p_Var18 = (_func_void_uv__work_ptr_int *)(ulong)uVar7;
    goto LAB_0054774f;
  case 2:
    uVar7 = close(*(int *)w[-2].wq);
    break;
  case 3:
    process = uv__fs_read;
    goto LAB_00547069;
  case 4:
    process = uv__fs_write;
LAB_00547069:
    p_Var18 = (_func_void_uv__work_ptr_int *)uv__fs_buf_iter((uv_fs_t *)w[-9].wq,process);
    goto LAB_0054748e;
  case 5:
    local_2058[0] = w[-1].done;
    sVar13 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)local_2058,
                        (size_t)w[1].done);
    local_20a8 = w[-1].done;
    if (local_2058[0] + -(long)local_20a8 != (_func_void_uv__work_ptr_int *)0x0 &&
        (long)local_20a8 <= (long)local_2058[0] || sVar13 != -1) {
      w[-1].done = local_2058[0];
      p_Var18 = local_2058[0] + -(long)local_20a8;
      goto LAB_0054748e;
    }
    uVar7 = *puVar9;
    if (((0x16 < uVar7) || ((0x440020U >> (uVar7 & 0x1f) & 1) == 0)) &&
       (p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar7 != 0x58))
    goto LAB_0054748e;
    *puVar9 = 0;
    p_Var18 = w[1].done;
    if (p_Var18 != (_func_void_uv__work_ptr_int *)0x0) {
      iVar5 = *(int *)w[-2].wq;
      iVar6 = *(int *)((long)w[-2].wq + 4);
      bVar4 = true;
      p_Var16 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00547503:
      while( true ) {
        sVar17 = (long)p_Var18 - (long)p_Var16;
        if (0x1fff < sVar17) {
          sVar17 = 0x2000;
        }
        do {
          if (bVar4) {
            sVar12 = pread64(iVar6,local_2038,sVar17,(__off64_t)local_20a8);
          }
          else {
            sVar12 = read(iVar6,local_2038,sVar17);
          }
          if (sVar12 != 0xffffffffffffffff) {
            if (sVar12 == 0) goto LAB_005476c2;
            if ((long)sVar12 < 1) goto LAB_0054763d;
            lVar10 = 0;
            sVar17 = sVar12;
            goto LAB_005475a6;
          }
          uVar7 = *puVar9;
        } while (uVar7 == 4);
        if ((!bVar4) || (p_Var16 != (_func_void_uv__work_ptr_int *)0x0)) break;
        bVar4 = false;
        p_Var16 = (_func_void_uv__work_ptr_int *)0x0;
        if ((uVar7 != 5) && (p_Var16 = (_func_void_uv__work_ptr_int *)0x0, uVar7 != 0x1d)) {
          p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          goto LAB_0054748e;
        }
      }
      p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      if (p_Var16 + 1 < (code *)0x2) goto LAB_0054748e;
      goto LAB_005476cd;
    }
    p_Var16 = (_func_void_uv__work_ptr_int *)0x0;
    goto LAB_005476cd;
  case 6:
    uVar7 = stat64((char *)w[-6].done,local_2038);
    goto LAB_00547154;
  case 7:
    uVar7 = lstat64((char *)w[-6].done,local_2038);
    goto LAB_00547154;
  case 8:
    uVar7 = fstat64(*(int *)w[-2].wq,local_2038);
LAB_00547154:
    if (uVar7 == 0) {
      w[-6].loop = (uv_loop_s *)local_2038[0].st_dev;
      w[-6].wq[0] = (void *)(local_2038[0]._24_8_ & 0xffffffff);
      w[-6].wq[1] = (void *)local_2038[0].st_nlink;
      auVar2._8_4_ = local_2038[0].st_gid;
      auVar2._0_8_ = (ulong)local_2038[0]._24_8_ >> 0x20;
      auVar2._12_4_ = 0;
      w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2038[0]._24_8_ >> 0x20);
      w[-5].done = (_func_void_uv__work_ptr_int *)auVar2._8_8_;
      w[-5].loop = (uv_loop_s *)local_2038[0].st_rdev;
      w[-5].wq[0] = (void *)local_2038[0].st_ino;
      w[-5].wq[1] = (void *)local_2038[0].st_size;
      w[-4].work = (_func_void_uv__work_ptr *)local_2038[0].st_blksize;
      w[-4].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_blocks;
      w[-4].wq[1] = (void *)local_2038[0].st_atim.tv_sec;
      w[-3].work = (_func_void_uv__work_ptr *)local_2038[0].st_atim.tv_nsec;
      w[-3].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_mtim.tv_sec;
      w[-3].loop = (uv_loop_s *)local_2038[0].st_mtim.tv_nsec;
      w[-2].work = (_func_void_uv__work_ptr *)local_2038[0].st_ctim.tv_sec;
      w[-2].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_ctim.tv_nsec;
      w[-3].wq[0] = (void *)local_2038[0].st_ctim.tv_sec;
      w[-3].wq[1] = (void *)local_2038[0].st_ctim.tv_nsec;
      w[-4].loop = (uv_loop_s *)0x0;
      w[-4].wq[0] = (void *)0x0;
    }
    break;
  case 9:
    uVar7 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
    break;
  case 10:
    local_2038[0].st_dev = (__dev_t)(double)w[-1].wq[0];
    local_2038[0].st_ino = (__ino64_t)(double)w[-1].wq[1];
    uVar7 = utime((char *)w[-6].done,(utimbuf *)local_2038);
    break;
  case 0xb:
    if (uv__fs_futime_no_utimesat == '\0') {
      local_2038[0].st_dev = (__dev_t)(double)w[-1].wq[0];
      dVar3 = (double)w[-1].wq[0] * 1000000.0;
      uVar14 = (ulong)dVar3;
      local_2038[0].st_ino =
           (((long)(dVar3 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) % 1000000) *
           1000;
      local_2038[0].st_nlink = (__nlink_t)(double)w[-1].wq[1];
      dVar3 = (double)w[-1].wq[1] * 1000000.0;
      uVar14 = (ulong)dVar3;
      local_2038[0]._24_8_ =
           (((long)(dVar3 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) % 1000000) *
           1000;
      p_Var18 = (_func_void_uv__work_ptr_int *)0x0;
      iVar5 = uv__utimesat(*(int *)w[-2].wq,(char *)0x0,(timespec *)local_2038,0);
      if (iVar5 != 0) {
        if (*puVar9 == 0x26) {
          uv__fs_futime_no_utimesat = '\x01';
          goto LAB_0054731f;
        }
        p_Var18 = (_func_void_uv__work_ptr_int *)(long)iVar5;
      }
    }
    else {
LAB_0054731f:
      local_2078.tv_sec = (__time_t)(double)w[-1].wq[0];
      dVar3 = (double)w[-1].wq[0] * 1000000.0;
      uVar14 = (ulong)dVar3;
      local_2078.tv_usec =
           ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) % 1000000;
      local_2068 = (long)(double)w[-1].wq[1];
      dVar3 = (double)w[-1].wq[1] * 1000000.0;
      uVar14 = (ulong)dVar3;
      local_2060 = ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) % 1000000
      ;
      p_Var18 = (_func_void_uv__work_ptr_int *)0x0;
      snprintf((char *)local_2058,0x1b,"/proc/self/fd/%d",(ulong)*(uint *)w[-2].wq);
      iVar5 = utimes((char *)local_2058,&local_2078);
      if (iVar5 != 0) {
        uVar7 = *puVar9;
        if ((uVar7 == 0x14) || (uVar7 == 0xd)) {
LAB_0054741b:
          *puVar9 = 0x26;
        }
        else if (uVar7 == 2) {
          iVar6 = fcntl64(*(undefined4 *)w[-2].wq,3);
          if ((iVar6 != -1) || (*puVar9 != 9)) goto LAB_0054741b;
        }
        p_Var18 = (_func_void_uv__work_ptr_int *)(long)iVar5;
      }
    }
    goto LAB_0054748e;
  case 0xc:
    uVar7 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    uVar7 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    uVar7 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    uVar7 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    uVar7 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    uVar7 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    uVar7 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    uVar7 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar11 = mkdtemp((char *)w[-6].done);
    p_Var18 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar11 == (char *)0x0);
    goto LAB_0054748e;
  case 0x15:
    uVar7 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038[0].st_dev = 0;
    iVar5 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                      uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar5 != -1) {
      puVar15 = (uv_loop_s *)local_2038[0].st_dev;
      if (iVar5 == 0) {
        free((void *)local_2038[0].st_dev);
        puVar15 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar15;
      goto LAB_0054769b;
    }
    p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_0054748e;
  case 0x17:
    uVar7 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    uVar7 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar12 = pathconf((char *)w[-6].done,4);
    sVar17 = 0x1000;
    if (sVar12 != 0xffffffffffffffff) {
      sVar17 = sVar12;
    }
    __resolved = (_func_void_uv__work_ptr *)uv__malloc(sVar17 + 1);
    if (__resolved == (_func_void_uv__work_ptr *)0x0) {
      *puVar9 = 0xc;
    }
    else {
      sVar13 = readlink((char *)w[-6].done,(char *)__resolved,sVar17);
      if (sVar13 != -1) {
        __resolved[sVar13] = (_func_void_uv__work_ptr)0x0;
LAB_00547738:
        w[-6].work = __resolved;
        w[-7].wq[1] = (void *)0x0;
        goto LAB_0054775b;
      }
      uv__free(__resolved);
    }
    goto LAB_00547498;
  case 0x1a:
    uVar7 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    uVar7 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    lVar10 = pathconf((char *)w[-6].done,4);
    sVar17 = 0x1001;
    if (lVar10 + 1U != 0) {
      sVar17 = lVar10 + 1U;
    }
    __resolved = (_func_void_uv__work_ptr *)uv__malloc(sVar17);
    if (__resolved == (_func_void_uv__work_ptr *)0x0) {
      *puVar9 = 0xc;
    }
    else {
      pcVar11 = realpath((char *)w[-6].done,(char *)__resolved);
      if (pcVar11 != (char *)0x0) goto LAB_00547738;
      uv__free(__resolved);
    }
    goto LAB_00547498;
  default:
    goto switchD_00546e07_default;
  }
  p_Var18 = (_func_void_uv__work_ptr_int *)(long)(int)uVar7;
  goto LAB_0054748e;
LAB_005475a6:
LAB_005475b9:
  do {
    sVar13 = write(iVar5,(void *)((long)local_2038[0].__unused + lVar10 + -0x78),sVar17);
    if (sVar13 != -1) break;
    if (*puVar9 != 4) {
      if (*puVar9 == 0xb) {
        local_2078.tv_sec = CONCAT44(4,iVar5);
        while( true ) {
          iVar8 = poll((pollfd *)&local_2078,1,-1);
          if (iVar8 != -1) break;
          if (*puVar9 != 4) goto LAB_005476de;
        }
        if ((local_2078.tv_sec & 0xfffb000000000000U) == 0) goto LAB_005475b9;
LAB_005476de:
        *puVar9 = 5;
      }
      p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0054748e;
    }
  } while( true );
  lVar10 = lVar10 + sVar13;
  sVar17 = sVar12 - lVar10;
  if (sVar17 == 0 || (long)sVar12 < lVar10) goto LAB_0054763d;
  goto LAB_005475a6;
LAB_0054763d:
  local_20a8 = local_20a8 + sVar12;
  p_Var16 = p_Var16 + sVar12;
  if (p_Var18 <= p_Var16) goto LAB_005476c2;
  goto LAB_00547503;
LAB_005476c2:
  if (p_Var16 == (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
    p_Var18 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
  }
  else {
LAB_005476cd:
    w[-1].done = local_20a8;
    p_Var18 = p_Var16;
  }
LAB_0054748e:
  if (p_Var18 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_0054774f:
    w[-7].wq[1] = p_Var18;
    if (p_Var18 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_0054775b:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
    return;
  }
LAB_00547498:
  if (((long)(int)*puVar9 != 4) || (iVar1 == 2)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar9;
    return;
  }
  goto LAB_00546de7;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_buf_iter(req, uv__fs_read));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_buf_iter(req, uv__fs_write));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = -errno;
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}